

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_psbt_finalize(wally_psbt *psbt)

{
  wally_tx_output *pwVar1;
  _Bool _Var2;
  int iVar3;
  bool is_p2sh_00;
  wally_tx_output *out;
  _Bool is_p2sh;
  size_t sStack_48;
  _Bool is_witness;
  size_t type;
  size_t out_script_len;
  uchar *out_script;
  wally_psbt_input *pwStack_28;
  uint32_t utxo_index;
  wally_psbt_input *input;
  size_t i;
  wally_psbt *psbt_local;
  
  if (((psbt == (wally_psbt *)0x0) || (psbt->tx == (wally_tx *)0x0)) ||
     (psbt->tx->num_inputs != psbt->num_inputs)) {
    psbt_local._4_4_ = -2;
  }
  else {
    i = (size_t)psbt;
    for (input = (wally_psbt_input *)0x0; input < *(wally_psbt_input **)(i + 0x18);
        input = (wally_psbt_input *)((long)&input->utxo + 1)) {
      pwStack_28 = (wally_psbt_input *)(*(long *)(i + 0x10) + (long)input * 0x110);
      out_script._4_4_ = *(uint *)(*(long *)(*(long *)(i + 8) + 8) + (long)input * 0xd0 + 0x20);
      out_script_len = 0;
      out._7_1_ = false;
      if ((pwStack_28->final_scriptsig == (uchar *)0x0) &&
         (pwStack_28->final_witness == (wally_tx_witness_stack *)0x0)) {
        if ((pwStack_28->witness_utxo == (wally_tx_output *)0x0) ||
           (pwStack_28->witness_utxo->script_len == 0)) {
          if ((pwStack_28->utxo != (wally_tx *)0x0) &&
             ((ulong)out_script._4_4_ < pwStack_28->utxo->num_outputs)) {
            pwVar1 = pwStack_28->utxo->outputs;
            out_script_len = (size_t)pwVar1[out_script._4_4_].script;
            type = pwVar1[out_script._4_4_].script_len;
          }
        }
        else {
          out_script_len = (size_t)pwStack_28->witness_utxo->script;
          type = pwStack_28->witness_utxo->script_len;
          out._7_1_ = true;
        }
        is_p2sh_00 = pwStack_28->redeem_script != (uchar *)0x0;
        if (is_p2sh_00) {
          out_script_len = (size_t)pwStack_28->redeem_script;
          type = pwStack_28->redeem_script_len;
        }
        if (pwStack_28->witness_script != (uchar *)0x0) {
          out_script_len = (size_t)pwStack_28->witness_script;
          type = pwStack_28->witness_script_len;
          out._7_1_ = true;
        }
        if ((out_script_len != 0) &&
           (iVar3 = wally_scriptpubkey_get_type
                              ((uchar *)out_script_len,type,&stack0xffffffffffffffb8), iVar3 == 0))
        {
          if (sStack_48 == 2) {
            _Var2 = finalize_p2pkh(pwStack_28);
            if (_Var2) goto LAB_00773aae;
          }
          else if (sStack_48 == 8) {
            _Var2 = finalize_p2wpkh(pwStack_28);
            if (_Var2) goto LAB_00773aae;
          }
          else if ((sStack_48 == 0x20) &&
                  (_Var2 = finalize_multisig(pwStack_28,(uchar *)out_script_len,type,out._7_1_,
                                             is_p2sh_00), _Var2)) {
LAB_00773aae:
            clear_and_free(pwStack_28->redeem_script,pwStack_28->redeem_script_len);
            pwStack_28->redeem_script_len = 0;
            pwStack_28->redeem_script = (uchar *)0x0;
            clear_and_free(pwStack_28->witness_script,pwStack_28->witness_script_len);
            pwStack_28->witness_script_len = 0;
            pwStack_28->witness_script = (uchar *)0x0;
            wally_map_clear(&pwStack_28->keypaths);
            wally_map_clear(&pwStack_28->signatures);
            pwStack_28->sighash = 0;
          }
        }
      }
    }
    psbt_local._4_4_ = 0;
  }
  return psbt_local._4_4_;
}

Assistant:

int wally_psbt_finalize(struct wally_psbt *psbt)
{
    size_t i;

    if (!psbt || !psbt->tx || psbt->tx->num_inputs != psbt->num_inputs)
        return WALLY_EINVAL;

    for (i = 0; i < psbt->num_inputs; ++i) {
        struct wally_psbt_input *input = &psbt->inputs[i];
        const uint32_t utxo_index = psbt->tx->inputs[i].index;

        /* Script for this input. originally set to the input's scriptPubKey, but in the case of a p2sh/p2wsh
         * input, it will be eventually be set to the unhashed script, if known */
        unsigned char *out_script = NULL;
        size_t out_script_len, type;
        bool is_witness = false, is_p2sh = false;

        if (input->final_scriptsig || input->final_witness)
            continue; /* Already finalized */

        /* Note that if we patch libwally to supply the non-witness utxo tx field (tx) for
        * witness inputs also, we'll need a different way to signal p2sh-p2wpkh scripts */
        if (input->witness_utxo && input->witness_utxo->script_len > 0) {
            out_script = input->witness_utxo->script;
            out_script_len = input->witness_utxo->script_len;
            is_witness = true;
        } else if (input->utxo && utxo_index < input->utxo->num_outputs) {
            struct wally_tx_output *out = &input->utxo->outputs[utxo_index];
            out_script = out->script;
            out_script_len = out->script_len;
        }
        if (input->redeem_script) {
            out_script = input->redeem_script;
            out_script_len = input->redeem_script_len;
            is_p2sh = true;
        }
        if (input->witness_script) {
            out_script = input->witness_script;
            out_script_len = input->witness_script_len;
            is_witness = true;
        }

        if (!out_script)
            continue; /* We need an outscript to do anything */

        if (wally_scriptpubkey_get_type(out_script, out_script_len, &type) != WALLY_OK)
            continue; /* Can't identify the type, skip */

        switch(type) {
        case WALLY_SCRIPT_TYPE_P2PKH:
            if (!finalize_p2pkh(input))
                continue;
            break;
        case WALLY_SCRIPT_TYPE_P2WPKH:
            if (!finalize_p2wpkh(input))
                continue;
            break;
        case WALLY_SCRIPT_TYPE_MULTISIG:
            if (!finalize_multisig(input, out_script, out_script_len, is_witness, is_p2sh))
                continue;
            break;
        default:
            continue; /* Can't finalize this input, skip */
        }

        /* Clear non-final things */
        clear_and_free(input->redeem_script, input->redeem_script_len);
        input->redeem_script_len = 0;
        input->redeem_script = NULL;
        clear_and_free(input->witness_script, input->witness_script_len);
        input->witness_script_len = 0;
        input->witness_script = NULL;
        wally_map_clear(&input->keypaths);
        wally_map_clear(&input->signatures);
        input->sighash = 0;
    }
    return WALLY_OK;
}